

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.c
# Opt level: O0

void yy_parse_failed(yyParser *yypParser)

{
  calculator_t *pcVar1;
  calculator_t *state;
  yyParser *yypParser_local;
  
  pcVar1 = yypParser->state;
  if (yyTraceFILE != (FILE *)0x0) {
    fprintf((FILE *)yyTraceFILE,"%sFail!\n",yyTracePrompt);
  }
  while (yypParser->yystack < yypParser->yytos) {
    yy_pop_parser_stack(yypParser);
  }
  yypParser->state = pcVar1;
  return;
}

Assistant:

static void yy_parse_failed(
  yyParser *yypParser           /* The parser */
){
  ParseARG_FETCH
  ParseCTX_FETCH
#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sFail!\n",yyTracePrompt);
  }
#endif
  while( yypParser->yytos>yypParser->yystack ) yy_pop_parser_stack(yypParser);
  /* Here code is inserted which will be executed whenever the
  ** parser fails */
/************ Begin %parse_failure code ***************************************/
/************ End %parse_failure code *****************************************/
  ParseARG_STORE /* Suppress warning about unused %extra_argument variable */
  ParseCTX_STORE
}